

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

void __thiscall
Diligent::RefCntAutoPtr<Diligent::DeviceContextVkImpl>::RefCntAutoPtr
          (RefCntAutoPtr<Diligent::DeviceContextVkImpl> *this,DeviceContextVkImpl *pObj)

{
  this->m_pObject = pObj;
  if (pObj != (DeviceContextVkImpl *)0x0) {
    RefCountedObject<Diligent::IDeviceContextVk>::AddRef
              ((RefCountedObject<Diligent::IDeviceContextVk> *)pObj);
  }
  return;
}

Assistant:

explicit RefCntAutoPtr(T* pObj) noexcept :
        m_pObject{pObj}
    {
        if (m_pObject)
            m_pObject->AddRef();
    }